

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.h
# Opt level: O3

void __thiscall CodeGenWorkItem::VerifyJitMode(CodeGenWorkItem *this)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  char cVar4;
  uint sourceContextId;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  
  cVar4 = (this->jitData).jitMode;
  if (cVar4 == '\x03') {
LAB_004018d1:
    bVar3 = Js::FunctionBody::DoSimpleJit(this->functionBody);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                         ,0xa0,
                         "(GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit())"
                         ,
                         "GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit()"
                        );
      if (!bVar3) goto LAB_00401a33;
      *puVar5 = 0;
    }
    cVar4 = (this->jitData).jitMode;
LAB_00401939:
    if (cVar4 != '\x04') {
      return;
    }
  }
  else if (cVar4 != '\x04') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                       ,0x9f,
                       "(GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit)"
                       ,
                       "GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit"
                      );
    if (!bVar3) goto LAB_00401a33;
    *puVar5 = 0;
    cVar4 = (this->jitData).jitMode;
    if (cVar4 == '\x03') goto LAB_004018d1;
    goto LAB_00401939;
  }
  sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->functionBody);
  pFVar1 = this->functionBody;
  pFVar6 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_00401a33;
    *puVar5 = 0;
    pFVar6 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,FullJitPhase,sourceContextId,pFVar6->functionId);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                       ,0xa1,
                       "(GetJitMode() != ExecutionMode::FullJit || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::FullJitPhase)), ((GetFunctionBody())->GetSourceContextId()), ((GetFunctionBody())->GetLocalFunctionId())))"
                       ,
                       "GetJitMode() != ExecutionMode::FullJit || !PHASE_OFF(Js::FullJitPhase, GetFunctionBody())"
                      );
    if (!bVar3) {
LAB_00401a33:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void VerifyJitMode() const
    {
        Assert(GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit);
        Assert(GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit());
        Assert(GetJitMode() != ExecutionMode::FullJit || !PHASE_OFF(Js::FullJitPhase, GetFunctionBody()));
    }